

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator[](Value *this,UInt index)

{
  ushort uVar1;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  int iVar2;
  char *pcVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  CZString key;
  value_type defaultValue;
  CZString local_50;
  ValueHolder local_40;
  ushort local_38;
  Value local_30;
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
    pcVar3 = (char *)operator_new(0x30);
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\0';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    *(char **)(pcVar3 + 0x18) = pcVar3 + 8;
    *(char **)(pcVar3 + 0x20) = pcVar3 + 8;
    pcVar3[0x28] = '\0';
    pcVar3[0x29] = '\0';
    pcVar3[0x2a] = '\0';
    pcVar3[0x2b] = '\0';
    pcVar3[0x2c] = '\0';
    pcVar3[0x2d] = '\0';
    pcVar3[0x2e] = '\0';
    pcVar3[0x2f] = '\0';
    local_40 = this->value_;
    (this->value_).string_ = pcVar3;
    *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 6;
    local_38 = uVar1 & 0x1ff;
    ~Value((Value *)&local_40);
  }
  else if ((char)uVar1 != '\x06') {
    __assert_fail("type_ == nullValue || type_ == arrayValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                  ,0x33f,"Value &Json::Value::operator[](UInt)");
  }
  local_50.cstr_ = (char *)0x0;
  this_00 = &((this->value_).map_)->_M_t;
  local_50.index_ = index;
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::_M_lower_bound(this_00,(_Link_type)
                                   (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                           &(this_00->_M_impl).super__Rb_tree_header._M_header,&local_50);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var5 = iVar4._M_node + 1;
    if (*(char **)(iVar4._M_node + 1) == (char *)0x0) {
      if (*(UInt *)&iVar4._M_node[1]._M_parent == local_50.index_) goto LAB_001c3270;
    }
    else {
      iVar2 = strcmp(*(char **)(iVar4._M_node + 1),local_50.cstr_);
      if (iVar2 == 0) goto LAB_001c3270;
    }
  }
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            ((pair<const_Json::Value::CZString,_Json::Value> *)&local_40,&local_50,(Value *)null);
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,iVar4._M_node,
                     (pair<const_Json::Value::CZString,_Json::Value> *)&local_40);
  p_Var5 = iVar4._M_node + 1;
  ~Value(&local_30);
  CZString::~CZString((CZString *)&local_40);
LAB_001c3270:
  CZString::~CZString(&local_50);
  return (Value *)&p_Var5->_M_left;
}

Assistant:

Value&
Value::operator[] ( UInt index )
{
    JSON_ASSERT ( type_ == nullValue  ||  type_ == arrayValue );

    if ( type_ == nullValue )
        *this = Value ( arrayValue );

    CZString key ( index );
    ObjectValues::iterator it = value_.map_->lower_bound ( key );

    if ( it != value_.map_->end ()  &&  (*it).first == key )
        return (*it).second;

    ObjectValues::value_type defaultValue ( key, null );
    it = value_.map_->insert ( it, defaultValue );
    return (*it).second;
}